

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restore.c
# Opt level: O3

void reset_oattached_mids(boolean ghostly,level *lev)

{
  byte *pbVar1;
  uint uVar2;
  boolean bVar3;
  uint uVar4;
  undefined8 in_RAX;
  obj *poVar5;
  uint nid;
  undefined8 uStack_28;
  
  poVar5 = lev->objlist;
  if (poVar5 != (obj *)0x0) {
    uStack_28 = in_RAX;
    do {
      if (ghostly != '\0') {
        uVar2 = *(uint *)&poVar5->field_0x4a;
        uVar4 = uVar2 & 0x600000;
        if (uVar4 == 0x400000) {
          bVar3 = lookup_id_mapping(poVar5->oextra[0],(uint *)((long)&uStack_28 + 4));
          if (bVar3 == '\0') {
            *(uint *)&poVar5->field_0x4a = uVar2 & 0xff9fffff;
          }
          else {
            poVar5->oextra[0] = uStack_28._4_4_;
          }
        }
        else if ((uVar4 == 0x200000) && (poVar5->oxlth != 0)) {
          *(undefined4 *)((long)&poVar5[1].olev + 4) = 0;
          *(undefined1 *)&poVar5[1].oeaten = 0;
          pbVar1 = (byte *)((long)&poVar5[1].age + 2);
          *pbVar1 = *pbVar1 & 0xbf;
        }
      }
      poVar5 = poVar5->nobj;
    } while (poVar5 != (obj *)0x0);
  }
  return;
}

Assistant:

static void reset_oattached_mids(boolean ghostly, struct level *lev)
{
    struct obj *otmp;
    unsigned oldid, nid;
    for (otmp = lev->objlist; otmp; otmp = otmp->nobj) {
	if (ghostly && otmp->oattached == OATTACHED_MONST && otmp->oxlth) {
	    struct monst *mtmp = (struct monst *)otmp->oextra;

	    mtmp->m_id = 0;
	    mtmp->mpeaceful = mtmp->mtame = 0;	/* pet's owner died! */
	}
	if (ghostly && otmp->oattached == OATTACHED_M_ID) {
	    memcpy(&oldid, (void *)otmp->oextra, sizeof(oldid));
	    if (lookup_id_mapping(oldid, &nid))
		memcpy(otmp->oextra, (void *)&nid, sizeof(nid));
	    else
		otmp->oattached = OATTACHED_NOTHING;
	}
    }
}